

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis-read.c
# Opt level: O3

int vorbis_next_packet(vorbis_stream_t *vorbis,buf_t *packet)

{
  ogg_page_t *page;
  int iVar1;
  
  if (vorbis == (vorbis_stream_t *)0x0) {
    __assert_fail("vorbis != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis-read.c",0x5d
                  ,"int vorbis_next_packet(vorbis_stream_t *, buf_t *)");
  }
  if (packet != (buf_t *)0x0) {
    if (packet->data == (uchar *)0x0) {
      __assert_fail("packet->data != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis-read.c",
                    0x5f,"int vorbis_next_packet(vorbis_stream_t *, buf_t *)");
    }
    packet->len = 0;
    page = &vorbis->page;
    if ((vorbis->page).page_segments <= vorbis->segment) {
      iVar1 = ogg_next_page(&vorbis->file,page);
      if (iVar1 == 0) {
        return 0;
      }
      vorbis->segment = '\0';
    }
    while( true ) {
      iVar1 = vorbis_packet_in_page(vorbis,page,packet);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = ogg_next_page(&vorbis->file,page);
      if (iVar1 == 0) break;
      vorbis->segment = '\0';
      if (((uint)(vorbis->page).b & 1) == 0) {
        vorbis_next_packet_cold_1();
        return 0;
      }
    }
    return 0;
  }
  __assert_fail("packet != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis-read.c",0x5e,
                "int vorbis_next_packet(vorbis_stream_t *, buf_t *)");
}

Assistant:

int vorbis_next_packet(vorbis_stream_t *vorbis, buf_t *packet) {
  assert(vorbis != NULL);
  assert(packet != NULL);
  assert(packet->data != NULL);

  packet->len = 0;

  /*M
    Check if we have to read in a new page.
  **/
  if (vorbis->segment >= vorbis->page.page_segments) {
    if (!ogg_next_page(&vorbis->file, &vorbis->page))
      return 0;
    vorbis->segment = 0;
  }

 again:
  if (vorbis_packet_in_page(vorbis, &vorbis->page, packet))
    return 1;

  /*M
    Not enough segments for complete packet in page, read a new page
    and hope it is a continuation page.
  **/
  if (!ogg_next_page(&vorbis->file, &vorbis->page))
    return 0;

  vorbis->segment = 0;

  /*M
    Check if the next page is a continuation page.
  **/
  if (vorbis->page.b.continuation == 0) {
    fprintf(stderr, "Subsequent page was not continuation page.\n");
    return 0;
  }

  goto again;
}